

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_WhenAFieldFidIsRedefinedItsOldDefinitionIsRemoved_Test::
~ExtendedDataDictionaryTest_WhenAFieldFidIsRedefinedItsOldDefinitionIsRemoved_Test
          (ExtendedDataDictionaryTest_WhenAFieldFidIsRedefinedItsOldDefinitionIsRemoved_Test *this)

{
  ExtendedDataDictionaryTest_WhenAFieldFidIsRedefinedItsOldDefinitionIsRemoved_Test *this_local;
  
  ~ExtendedDataDictionaryTest_WhenAFieldFidIsRedefinedItsOldDefinitionIsRemoved_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtendedDataDictionaryTest, WhenAFieldFidIsRedefinedItsOldDefinitionIsRemoved)
{
    ExtendableDataDictionary extendable_data_dictionary6 = CreateExtendableDataDictionary();
    FieldDef redefined(4, bid2.type_, bid2.name_, FieldEncodingEnum::FIXED1, 1);
    extendable_data_dictionary6.AddFieldDef(redefined);
    ASSERT_FALSE(extendable_data_dictionary6.FieldDefByFid(bid2.fid_));
    std::vector<FieldDef> actual = {ask2, bid_size2, ask_size2, redefined, status2};
    ASSERT_EQ(actual, extendable_data_dictionary6.AllFieldDefs());
}